

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniz.c
# Opt level: O2

tdefl_status
tdefl_compress(tdefl_compressor *d,void *pIn_buf,size_t *pIn_buf_size,void *pOut_buf,
              size_t *pOut_buf_size,tdefl_flush flush)

{
  mz_uint *pmVar1;
  mz_uint16 *__s;
  mz_uint16 *pmVar2;
  byte bVar3;
  mz_uint8 mVar4;
  mz_uint8 mVar5;
  ushort uVar6;
  mz_uint mVar7;
  mz_uint mVar8;
  uint uVar9;
  mz_uint8 *pmVar10;
  tdefl_status tVar11;
  uint uVar12;
  int iVar13;
  ulong uVar14;
  mz_ulong mVar15;
  byte *pbVar16;
  uint uVar17;
  uint uVar18;
  uint uVar19;
  uint uVar20;
  uint uVar23;
  uint uVar24;
  uint uVar25;
  size_t sVar26;
  ulong uVar27;
  byte *pbVar28;
  uint local_90;
  mz_uint local_7c;
  int local_50;
  ulong uVar21;
  ulong uVar22;
  
  if (d == (tdefl_compressor *)0x0) {
    if (pIn_buf_size != (size_t *)0x0) {
      *pIn_buf_size = 0;
    }
    if (pOut_buf_size == (size_t *)0x0) {
      return TDEFL_STATUS_BAD_PARAM;
    }
    *pOut_buf_size = 0;
    return TDEFL_STATUS_BAD_PARAM;
  }
  d->m_pIn_buf = pIn_buf;
  d->m_pIn_buf_size = pIn_buf_size;
  d->m_pOut_buf = pOut_buf;
  d->m_pOut_buf_size = pOut_buf_size;
  d->m_pSrc = (mz_uint8 *)pIn_buf;
  if (pIn_buf_size == (size_t *)0x0) {
    sVar26 = 0;
  }
  else {
    sVar26 = *pIn_buf_size;
  }
  d->m_src_buf_left = sVar26;
  d->m_out_buf_ofs = 0;
  d->m_flush = flush;
  if ((((d->m_pPut_buf_func == (tdefl_put_buf_func_ptr)0x0) ==
        (pOut_buf != (void *)0x0 || pOut_buf_size != (size_t *)0x0)) &&
      (d->m_prev_return_status == TDEFL_STATUS_OKAY)) &&
     (flush == TDEFL_FINISH || d->m_wants_to_finish == 0)) {
    if (((pIn_buf_size == (size_t *)0x0) || (pIn_buf != (void *)0x0)) || (*pIn_buf_size == 0)) {
      if (((pOut_buf_size == (size_t *)0x0) || (pOut_buf != (void *)0x0)) || (*pOut_buf_size == 0))
      {
        d->m_wants_to_finish = d->m_wants_to_finish | (uint)(flush == TDEFL_FINISH);
        if ((d->m_output_flush_remaining == 0) && (d->m_finished == 0)) {
          __s = d->m_next;
          local_50 = (int)d + 0x92aa;
          pbVar28 = (byte *)pIn_buf;
          do {
            do {
              if (sVar26 == 0) {
                if ((flush != TDEFL_NO_FLUSH) && (mVar7 = d->m_lookahead_size, mVar7 != 0))
                goto LAB_0045d044;
                uVar27 = 0;
LAB_0045d83f:
                d->m_pSrc = pbVar28;
                d->m_src_buf_left = uVar27;
                goto LAB_0045d84d;
              }
              mVar7 = d->m_lookahead_size;
LAB_0045d044:
              uVar20 = d->m_dict_size;
              if (uVar20 + mVar7 < 2) {
                uVar27 = sVar26;
                for (uVar14 = 0; iVar13 = (int)uVar14, sVar26 != uVar14; uVar14 = uVar14 + 1) {
                  if (0x101 < mVar7 + iVar13) goto LAB_0045d202;
                  bVar3 = pbVar28[uVar14];
                  mVar8 = d->m_lookahead_pos;
                  uVar25 = mVar7 + iVar13 + mVar8 & 0x7fff;
                  d->m_dict[uVar25] = bVar3;
                  if (uVar25 < 0x101) {
                    d->m_dict[(ulong)uVar25 + 0x8000] = bVar3;
                  }
                  d->m_lookahead_size = mVar7 + iVar13 + 1;
                  if (2 < mVar7 + uVar20 + 1 + iVar13) {
                    uVar25 = (mVar7 - 2) + iVar13 + mVar8 & 0x7fff;
                    uVar17 = (uint)bVar3 ^
                             (uint)d->m_dict[(mVar8 + mVar7 + iVar13) - 1 & 0x7fff] << 5 ^
                             (d->m_dict[uVar25] & 0x1f) << 10;
                    d->m_next[uVar25] = d->m_hash[uVar17];
                    d->m_hash[uVar17] = ((short)mVar8 + (short)(mVar7 + iVar13)) - 2;
                  }
                  uVar27 = uVar27 - 1;
                }
                uVar27 = 0;
LAB_0045d202:
                uVar25 = mVar7 + iVar13;
                pbVar28 = pbVar28 + uVar14;
              }
              else {
                mVar8 = d->m_lookahead_pos;
                uVar17 = (mVar8 + mVar7) - 2;
                uVar23 = mVar8 + mVar7;
                uVar14 = (ulong)((uint)d->m_dict[(mVar8 + mVar7) - 1 & 0x7fff] ^
                                (uint)d->m_dict[uVar17 & 0x7fff] << 5);
                uVar27 = sVar26 & 0xffffffff;
                if (0x102 - mVar7 <= sVar26) {
                  uVar27 = (ulong)(0x102 - mVar7);
                }
                pbVar16 = pbVar28 + uVar27;
                if (pbVar28 == (byte *)0x0) {
                  pbVar16 = (byte *)0x0;
                }
                uVar25 = (int)uVar27 + mVar7;
                d->m_lookahead_size = uVar25;
                for (; pbVar28 != pbVar16; pbVar28 = pbVar28 + 1) {
                  uVar23 = uVar23 & 0x7fff;
                  bVar3 = *pbVar28;
                  d->m_dict[uVar23] = bVar3;
                  if (uVar23 < 0x101) {
                    d->m_dict[(ulong)uVar23 + 0x8000] = bVar3;
                  }
                  uVar14 = (ulong)(((uint)uVar14 & 0x3ff) << 5 ^ (uint)bVar3);
                  d->m_next[uVar17 & 0x7fff] = d->m_hash[uVar14];
                  d->m_hash[uVar14] = (mz_uint16)uVar17;
                  uVar23 = uVar23 + 1;
                  uVar17 = uVar17 + 1;
                }
                uVar27 = sVar26 - uVar27;
              }
              uVar17 = 0x8000 - uVar25;
              if (uVar20 <= 0x8000 - uVar25) {
                uVar17 = uVar20;
              }
              d->m_dict_size = uVar17;
              if ((flush == TDEFL_NO_FLUSH) && (uVar25 < 0x102)) goto LAB_0045d83f;
              uVar20 = d->m_saved_match_len;
              uVar14 = (ulong)uVar20;
              if (uVar20 == 0) {
                uVar14 = 2;
              }
              uVar19 = (uint)uVar14;
              uVar23 = d->m_flags;
              uVar9 = d->m_lookahead_pos;
              uVar18 = uVar9 & 0x7fff;
              uVar21 = (ulong)uVar18;
              if ((uVar23 & 0x90000) == 0) {
                if (0x102 < uVar25) {
                  __assert_fail("max_match_len <= TDEFL_MAX_MATCH_LEN",
                                "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/external/miniz.c"
                                ,0x5cf,
                                "void tdefl_find_match(tdefl_compressor *, mz_uint, mz_uint, mz_uint, mz_uint *, mz_uint *)"
                               );
                }
                if (uVar19 < uVar25) {
                  local_7c = d->m_max_probes[0x1f < uVar19];
                  local_90 = 0;
                  uVar22 = uVar21;
                  do {
                    uVar12 = (uint)uVar14;
                    mVar4 = d->m_dict[(uVar18 + uVar19) - 1];
                    mVar5 = d->m_dict[uVar18 + uVar19];
                    do {
                      mVar7 = local_7c - 1;
                      do {
                        local_7c = mVar7;
                        if ((local_7c == 0) || (uVar6 = __s[uVar22], uVar6 == 0)) goto LAB_0045d478;
                        uVar24 = uVar9 - uVar6 & 0xffff;
                        if (uVar17 < uVar24) goto LAB_0045d478;
                        uVar19 = uVar6 & 0x7fff;
                        uVar22 = (ulong)uVar19;
                        uVar19 = uVar12 + uVar19;
                        if ((d->m_dict[uVar19] == mVar5) && (d->m_dict[uVar19 - 1] == mVar4)) break;
                        uVar6 = __s[uVar22];
                        if (uVar6 == 0) goto LAB_0045d478;
                        uVar24 = uVar9 - uVar6 & 0xffff;
                        if (uVar17 < uVar24) goto LAB_0045d478;
                        uVar19 = uVar6 & 0x7fff;
                        uVar22 = (ulong)uVar19;
                        uVar19 = uVar12 + uVar19;
                        if ((d->m_dict[uVar19] == mVar5) && (d->m_dict[uVar19 - 1] == mVar4)) break;
                        uVar6 = __s[uVar22];
                        if (uVar6 == 0) goto LAB_0045d478;
                        uVar24 = uVar9 - uVar6 & 0xffff;
                        if (uVar17 < uVar24) goto LAB_0045d478;
                        uVar19 = uVar6 & 0x7fff;
                        uVar22 = (ulong)uVar19;
                        uVar19 = uVar12 + uVar19;
                        mVar7 = local_7c - 1;
                      } while ((d->m_dict[uVar19] != mVar5) || (d->m_dict[uVar19 - 1] != mVar4));
                      if (uVar24 == 0) goto LAB_0045d478;
                      for (uVar14 = 0; uVar25 != (uint)uVar14; uVar14 = uVar14 + 1) {
                        if (d->m_dict[uVar14 + uVar21] != d->m_dict[uVar14 + uVar22])
                        goto LAB_0045d426;
                      }
                      uVar14 = (ulong)uVar25;
LAB_0045d426:
                      uVar19 = (uint)uVar14;
                    } while (uVar19 <= uVar12);
                    local_90 = uVar24;
                    uVar12 = uVar25;
                    if (uVar19 == uVar25) goto LAB_0045d478;
                    uVar14 = uVar14 & 0xffffffff;
                  } while( true );
                }
LAB_0045d450:
                local_90 = 0;
                uVar12 = uVar19;
              }
              else {
                if ((uVar23 >> 0x13 & 1) != 0 || uVar17 == 0) goto LAB_0045d450;
                uVar14 = 0;
                do {
                  if (uVar25 == uVar14) goto LAB_0045d467;
                  iVar13 = (int)uVar14;
                  uVar14 = uVar14 + 1;
                } while (d->m_dict[(uVar9 & 0x7fff) + iVar13] == d->m_dict[uVar9 - 1 & 0x7fff]);
                uVar25 = (int)uVar14 - 1;
LAB_0045d467:
                local_90 = (uint)(2 < uVar25);
                uVar12 = uVar25;
                if (2 >= uVar25) {
                  uVar12 = 0;
                }
              }
LAB_0045d478:
              if (((uVar12 == 3 && 0x1fff < local_90) || (uVar18 == local_90)) ||
                 (((uVar23 >> 0x11 & 1) != 0 && (uVar12 < 6)))) {
                if (uVar20 != 0) {
LAB_0045d4af:
                  if ((uVar20 < 3) || (uVar25 = d->m_saved_match_dist - 1, 0x7fff < uVar25)) {
LAB_0045d90c:
                    __assert_fail("(match_len >= TDEFL_MIN_MATCH_LEN) && (match_dist >= 1) && (match_dist <= TDEFL_LZ_DICT_SIZE)"
                                  ,
                                  "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/external/miniz.c"
                                  ,0x6c0,
                                  "void tdefl_record_match(tdefl_compressor *, mz_uint, mz_uint)");
                  }
                  d->m_total_lz_bytes = d->m_total_lz_bytes + uVar20;
                  *d->m_pLZ_code_buf = (mz_uint8)(uVar20 - 3);
                  d->m_pLZ_code_buf[1] = (mz_uint8)uVar25;
                  d->m_pLZ_code_buf[2] = (mz_uint8)(uVar25 >> 8);
                  d->m_pLZ_code_buf = d->m_pLZ_code_buf + 3;
                  *d->m_pLZ_flags = *d->m_pLZ_flags >> 1 | 0x80;
                  pmVar1 = &d->m_num_flags_left;
                  *pmVar1 = *pmVar1 - 1;
                  if (*pmVar1 == 0) {
                    d->m_num_flags_left = 8;
                    pmVar10 = d->m_pLZ_code_buf;
                    d->m_pLZ_code_buf = pmVar10 + 1;
                    d->m_pLZ_flags = pmVar10;
                  }
                  pbVar16 = "" + (uVar25 >> 8);
                  if (uVar25 < 0x200) {
                    pbVar16 = "" + (uVar25 & 0x1ff);
                  }
                  pmVar2 = d->m_huff_count[1] + *pbVar16;
                  *pmVar2 = *pmVar2 + 1;
                  pmVar2 = d->m_huff_count[0] + s_tdefl_len_sym[uVar20 - 3];
                  *pmVar2 = *pmVar2 + 1;
                  uVar12 = d->m_saved_match_len - 1;
                  goto LAB_0045d564;
                }
LAB_0045d739:
                bVar3 = d->m_dict[uVar21];
                d->m_total_lz_bytes = d->m_total_lz_bytes + 1;
                pbVar16 = d->m_pLZ_code_buf;
                d->m_pLZ_code_buf = pbVar16 + 1;
                *pbVar16 = bVar3;
                *d->m_pLZ_flags = *d->m_pLZ_flags >> 1;
                pmVar1 = &d->m_num_flags_left;
                *pmVar1 = *pmVar1 - 1;
                if (*pmVar1 == 0) {
                  d->m_num_flags_left = 8;
                  pmVar10 = d->m_pLZ_code_buf;
                  d->m_pLZ_code_buf = pmVar10 + 1;
                  d->m_pLZ_flags = pmVar10;
                }
                pmVar2 = d->m_huff_count[0] + bVar3;
                *pmVar2 = *pmVar2 + 1;
LAB_0045d77c:
                uVar12 = 1;
              }
              else if (uVar20 == 0) {
                if (local_90 == 0) goto LAB_0045d739;
                if (((d->m_greedy_parsing == 0) && ((uVar23 >> 0x10 & 1) == 0)) && (uVar12 < 0x80))
                {
                  bVar3 = d->m_dict[uVar21];
                  goto LAB_0045d821;
                }
                if ((0x8000 < local_90) || (uVar12 < 3)) goto LAB_0045d90c;
                uVar20 = local_90 - 1;
                d->m_total_lz_bytes = d->m_total_lz_bytes + uVar12;
                *d->m_pLZ_code_buf = (mz_uint8)(uVar12 - 3);
                d->m_pLZ_code_buf[1] = (mz_uint8)uVar20;
                d->m_pLZ_code_buf[2] = (mz_uint8)(uVar20 >> 8);
                d->m_pLZ_code_buf = d->m_pLZ_code_buf + 3;
                *d->m_pLZ_flags = *d->m_pLZ_flags >> 1 | 0x80;
                pmVar1 = &d->m_num_flags_left;
                *pmVar1 = *pmVar1 - 1;
                if (*pmVar1 == 0) {
                  d->m_num_flags_left = 8;
                  pmVar10 = d->m_pLZ_code_buf;
                  d->m_pLZ_code_buf = pmVar10 + 1;
                  d->m_pLZ_flags = pmVar10;
                }
                pbVar16 = "" + (uVar20 >> 8);
                if (local_90 < 0x201) {
                  pbVar16 = "" + (uVar20 & 0x1ff);
                }
                pmVar2 = d->m_huff_count[1] + *pbVar16;
                *pmVar2 = *pmVar2 + 1;
                pmVar2 = d->m_huff_count[0] + s_tdefl_len_sym[uVar12 - 3];
                *pmVar2 = *pmVar2 + 1;
              }
              else {
                if (uVar12 <= uVar20) goto LAB_0045d4af;
                uVar20 = d->m_saved_lit;
                d->m_total_lz_bytes = d->m_total_lz_bytes + 1;
                pmVar10 = d->m_pLZ_code_buf;
                d->m_pLZ_code_buf = pmVar10 + 1;
                *pmVar10 = (mz_uint8)uVar20;
                *d->m_pLZ_flags = *d->m_pLZ_flags >> 1;
                pmVar1 = &d->m_num_flags_left;
                *pmVar1 = *pmVar1 - 1;
                if (*pmVar1 == 0) {
                  d->m_num_flags_left = 8;
                  pmVar10 = d->m_pLZ_code_buf;
                  d->m_pLZ_code_buf = pmVar10 + 1;
                  d->m_pLZ_flags = pmVar10;
                }
                pmVar2 = d->m_huff_count[0] + (uVar20 & 0xff);
                *pmVar2 = *pmVar2 + 1;
                if (uVar12 < 0x80) {
                  bVar3 = d->m_dict[uVar21];
LAB_0045d821:
                  d->m_saved_lit = (uint)bVar3;
                  d->m_saved_match_dist = local_90;
                  d->m_saved_match_len = uVar12;
                  goto LAB_0045d77c;
                }
                local_90 = local_90 - 1;
                if (0x7fff < local_90) goto LAB_0045d90c;
                d->m_total_lz_bytes = d->m_total_lz_bytes + uVar12;
                *d->m_pLZ_code_buf = (mz_uint8)(uVar12 - 3);
                d->m_pLZ_code_buf[1] = (mz_uint8)local_90;
                d->m_pLZ_code_buf[2] = (mz_uint8)(local_90 >> 8);
                d->m_pLZ_code_buf = d->m_pLZ_code_buf + 3;
                *d->m_pLZ_flags = *d->m_pLZ_flags >> 1 | 0x80;
                pmVar1 = &d->m_num_flags_left;
                *pmVar1 = *pmVar1 - 1;
                if (*pmVar1 == 0) {
                  d->m_num_flags_left = 8;
                  pmVar10 = d->m_pLZ_code_buf;
                  d->m_pLZ_code_buf = pmVar10 + 1;
                  d->m_pLZ_flags = pmVar10;
                }
                pbVar16 = "" + (local_90 >> 8);
                if (local_90 < 0x200) {
                  pbVar16 = "" + (local_90 & 0x1ff);
                }
                pmVar2 = d->m_huff_count[1] + *pbVar16;
                *pmVar2 = *pmVar2 + 1;
                pmVar2 = d->m_huff_count[0] + s_tdefl_len_sym[uVar12 - 3];
                *pmVar2 = *pmVar2 + 1;
LAB_0045d564:
                d->m_saved_match_len = 0;
              }
              d->m_lookahead_pos = d->m_lookahead_pos + uVar12;
              if (d->m_lookahead_size < uVar12) {
                __assert_fail("d->m_lookahead_size >= len_to_move",
                              "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/external/miniz.c"
                              ,0x755,"mz_bool tdefl_compress_normal(tdefl_compressor *)");
              }
              d->m_lookahead_size = d->m_lookahead_size - uVar12;
              uVar12 = uVar12 + d->m_dict_size;
              if (0x7fff < uVar12) {
                uVar12 = 0x8000;
              }
              d->m_dict_size = uVar12;
              sVar26 = uVar27;
            } while ((d->m_pLZ_code_buf <= d->m_lz_code_buf + 0xfff8) &&
                    ((d->m_total_lz_bytes < 0x7c01 ||
                     (((uint)(((int)d->m_pLZ_code_buf - local_50) * 0x73) >> 7 < d->m_total_lz_bytes
                      && ((d->m_flags & 0x80000) == 0))))));
            d->m_pSrc = pbVar28;
            d->m_src_buf_left = uVar27;
            iVar13 = tdefl_flush_block(d,0);
          } while (iVar13 == 0);
          if (iVar13 < 0) {
LAB_0045d8e2:
            return d->m_prev_return_status;
          }
LAB_0045d84d:
          if ((pIn_buf != (void *)0x0) && ((d->m_flags & 0x3000) != 0)) {
            mVar15 = mz_adler32((ulong)d->m_adler32,(uchar *)pIn_buf,(long)d->m_pSrc - (long)pIn_buf
                               );
            d->m_adler32 = (mz_uint)mVar15;
          }
          if ((((flush != TDEFL_NO_FLUSH) && (d->m_lookahead_size == 0)) && (d->m_src_buf_left == 0)
              ) && (d->m_output_flush_remaining == 0)) {
            iVar13 = tdefl_flush_block(d,flush);
            if (iVar13 < 0) goto LAB_0045d8e2;
            d->m_finished = (uint)(flush == TDEFL_FINISH);
            if (flush == TDEFL_FULL_FLUSH) {
              d->m_dict_size = 0;
              memset(__s,0,0x20000);
            }
          }
        }
        tVar11 = tdefl_flush_output_buffer(d);
        d->m_prev_return_status = tVar11;
        return tVar11;
      }
      goto LAB_0045cf68;
    }
  }
  else {
LAB_0045cf68:
    if (pIn_buf_size == (size_t *)0x0) goto LAB_0045cf71;
  }
  *pIn_buf_size = 0;
LAB_0045cf71:
  if (pOut_buf_size != (size_t *)0x0) {
    *pOut_buf_size = 0;
  }
  d->m_prev_return_status = TDEFL_STATUS_BAD_PARAM;
  return TDEFL_STATUS_BAD_PARAM;
}

Assistant:

tdefl_status tdefl_compress(tdefl_compressor *d, const void *pIn_buf, size_t *pIn_buf_size, void *pOut_buf, size_t *pOut_buf_size, tdefl_flush flush)
{
    if (!d)
    {
        if (pIn_buf_size)
            *pIn_buf_size = 0;
        if (pOut_buf_size)
            *pOut_buf_size = 0;
        return TDEFL_STATUS_BAD_PARAM;
    }

    d->m_pIn_buf = pIn_buf;
    d->m_pIn_buf_size = pIn_buf_size;
    d->m_pOut_buf = pOut_buf;
    d->m_pOut_buf_size = pOut_buf_size;
    d->m_pSrc = (const mz_uint8 *)(pIn_buf);
    d->m_src_buf_left = pIn_buf_size ? *pIn_buf_size : 0;
    d->m_out_buf_ofs = 0;
    d->m_flush = flush;

    if (((d->m_pPut_buf_func != NULL) == ((pOut_buf != NULL) || (pOut_buf_size != NULL))) || (d->m_prev_return_status != TDEFL_STATUS_OKAY) ||
        (d->m_wants_to_finish && (flush != TDEFL_FINISH)) || (pIn_buf_size && *pIn_buf_size && !pIn_buf) || (pOut_buf_size && *pOut_buf_size && !pOut_buf))
    {
        if (pIn_buf_size)
            *pIn_buf_size = 0;
        if (pOut_buf_size)
            *pOut_buf_size = 0;
        return (d->m_prev_return_status = TDEFL_STATUS_BAD_PARAM);
    }
    d->m_wants_to_finish |= (flush == TDEFL_FINISH);

    if ((d->m_output_flush_remaining) || (d->m_finished))
        return (d->m_prev_return_status = tdefl_flush_output_buffer(d));

#if MINIZ_USE_UNALIGNED_LOADS_AND_STORES && MINIZ_LITTLE_ENDIAN
    if (((d->m_flags & TDEFL_MAX_PROBES_MASK) == 1) &&
        ((d->m_flags & TDEFL_GREEDY_PARSING_FLAG) != 0) &&
        ((d->m_flags & (TDEFL_FILTER_MATCHES | TDEFL_FORCE_ALL_RAW_BLOCKS | TDEFL_RLE_MATCHES)) == 0))
    {
        if (!tdefl_compress_fast(d))
            return d->m_prev_return_status;
    }
    else
#endif /* #if MINIZ_USE_UNALIGNED_LOADS_AND_STORES && MINIZ_LITTLE_ENDIAN */
    {
        if (!tdefl_compress_normal(d))
            return d->m_prev_return_status;
    }

    if ((d->m_flags & (TDEFL_WRITE_ZLIB_HEADER | TDEFL_COMPUTE_ADLER32)) && (pIn_buf))
        d->m_adler32 = (mz_uint32)mz_adler32(d->m_adler32, (const mz_uint8 *)pIn_buf, d->m_pSrc - (const mz_uint8 *)pIn_buf);

    if ((flush) && (!d->m_lookahead_size) && (!d->m_src_buf_left) && (!d->m_output_flush_remaining))
    {
        if (tdefl_flush_block(d, flush) < 0)
            return d->m_prev_return_status;
        d->m_finished = (flush == TDEFL_FINISH);
        if (flush == TDEFL_FULL_FLUSH)
        {
            MZ_CLEAR_ARR(d->m_hash);
            MZ_CLEAR_ARR(d->m_next);
            d->m_dict_size = 0;
        }
    }

    return (d->m_prev_return_status = tdefl_flush_output_buffer(d));
}